

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QOcspResponse>::end(QList<QOcspResponse> *this)

{
  QOcspResponse *n;
  QArrayDataPointer<QOcspResponse> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QOcspResponse> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QOcspResponse> *)0x15b309);
  QArrayDataPointer<QOcspResponse>::operator->(in_RDI);
  n = QArrayDataPointer<QOcspResponse>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }